

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall sfc::Image::save_indexed(Image *this,string *path)

{
  bool bVar1;
  runtime_error *this_00;
  char *pcVar2;
  allocator<char> local_2b1;
  string local_2b0;
  uint local_28c;
  undefined1 local_288 [4];
  uint error;
  byte_vec_t buffer;
  rgba_color local_25c;
  reference puStack_258;
  rgba_color rgba;
  uint *c;
  iterator __end1;
  iterator __begin1;
  rgba_vec_t *__range1;
  State state;
  string *path_local;
  Image *this_local;
  
  state.super_LodePNGState._536_8_ = path;
  bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&this->_palette);
  if (bVar1) {
    set_default_palette(this,0x100);
  }
  lodepng::State::State((State *)&__range1);
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->_palette);
  c = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->_palette);
  while (bVar1 = __gnu_cxx::
                 operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&c), ((bVar1 ^ 0xffU) & 1) != 0) {
    puStack_258 = __gnu_cxx::
                  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&__end1);
    rgba_color::rgba_color(&local_25c,*puStack_258);
    lodepng_palette_add((LodePNGColorMode *)&state.super_LodePNGState.info_png.interlace_method,
                        local_25c.r,local_25c.g,local_25c.b,local_25c.a);
    lodepng_palette_add((LodePNGColorMode *)&state.super_LodePNGState.encoder.text_compression,
                        local_25c.r,local_25c.g,local_25c.b,local_25c.a);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  state.super_LodePNGState.encoder.text_compression = 3;
  state.super_LodePNGState.info_png.interlace_method = 3;
  state.super_LodePNGState.encoder._84_4_ = 8;
  state.super_LodePNGState.info_png._12_4_ = 8;
  state.super_LodePNGState.encoder.zlibsettings.custom_context._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288);
  local_28c = lodepng::encode((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,
                              &this->_indexed_data,this->_width,this->_height,(State *)&__range1);
  if (local_28c == 0) {
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        state.super_LodePNGState._536_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,pcVar2,&local_2b1);
    lodepng::save_file((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288,&local_2b0
                      );
    std::__cxx11::string::~string((string *)&local_2b0);
    std::allocator<char>::~allocator(&local_2b1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_288);
    lodepng::State::~State((State *)&__range1);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar2 = lodepng_error_text(local_28c);
  std::runtime_error::runtime_error(this_00,pcVar2);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Image::save_indexed(const std::string& path) {
  if (_palette.empty())
    set_default_palette();

  lodepng::State state;
  for (const auto& c : _palette) {
    rgba_color rgba(c);
    lodepng_palette_add(&state.info_png.color, rgba.r, rgba.g, rgba.b, rgba.a);
    lodepng_palette_add(&state.info_raw, rgba.r, rgba.g, rgba.b, rgba.a);
  }
  state.info_png.color.colortype = state.info_raw.colortype = LCT_PALETTE;
  state.info_png.color.bitdepth = state.info_raw.bitdepth = 8;
  state.encoder.auto_convert = 0;

  byte_vec_t buffer;
  unsigned error = lodepng::encode(buffer, _indexed_data, _width, _height, state);
  if (error)
    throw std::runtime_error(lodepng_error_text(error));
  lodepng::save_file(buffer, path.c_str());
}